

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.c
# Opt level: O1

void av1_fill_mode_rates(AV1_COMMON *cm,ModeCosts *mode_costs,FRAME_CONTEXT *fc)

{
  int (*paaiVar1) [2] [16];
  int (*costs) [2] [16];
  int *piVar2;
  int *piVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int (*paaiVar10) [13] [13];
  int (*paaiVar11) [13] [14];
  ulong uVar12;
  aom_cdf_prob (*paaaVar13) [5] [9];
  int (*paaiVar14) [3] [5];
  int (*paaiVar15) [6] [2];
  int (*paaiVar16) [3] [3];
  int (*paaiVar17) [3] [2];
  int (*paaiVar18) [2] [2];
  int (*paaaiVar19) [4] [13] [16];
  int (*paaaiVar20) [4] [13] [16];
  ModeCosts *pMVar21;
  int (*costs_00) [13] [13];
  int (*costs_01) [13];
  int (*costs_02) [13] [14];
  int (*paiVar22) [3];
  int (*paaiVar23) [3] [2];
  aom_cdf_prob (*cdf) [5] [9];
  int (*costs_03) [3] [5];
  int (*paiVar24) [2];
  aom_cdf_prob (*paaaVar25) [4] [17];
  aom_cdf_prob (*cdf_00) [4] [17];
  int (*costs_04) [7];
  int (*costs_05) [8];
  segmentation_probs *cdf_01;
  aom_cdf_prob (*cdf_02) [17];
  aom_cdf_prob (*paaVar26) [3];
  long lVar27;
  int (*paaiVar28) [4] [16];
  int (*costs_06) [4] [16];
  int (*costs_07) [4] [13] [16];
  aom_cdf_prob (*cdf_03) [5];
  long lVar29;
  aom_cdf_prob (*paaaVar30) [5] [14];
  aom_cdf_prob (*paaaVar31) [13] [15];
  aom_cdf_prob (*paaaVar32) [3] [4];
  long lVar33;
  aom_cdf_prob (*paaaVar34) [6] [3];
  aom_cdf_prob (*paaaVar35) [3] [3];
  aom_cdf_prob (*paaaVar36) [2] [3];
  int (*paaiVar37) [2] [16];
  aom_cdf_prob (*paaaaVar38) [4] [13] [17];
  aom_cdf_prob (*paaaaVar39) [4] [13] [17];
  int (*costs_08) [6] [2];
  int (*costs_09) [3] [3];
  int (*costs_10) [2] [2];
  aom_cdf_prob (*cdf_04) [9];
  int (*paiVar40) [16];
  aom_cdf_prob (*cdf_05) [4];
  bool bVar41;
  int sign_cost [8];
  long local_90;
  int local_58 [10];
  
  lVar29 = 0;
  pMVar21 = mode_costs;
  do {
    av1_cost_tokens_from_cdf
              ((int *)pMVar21,(aom_cdf_prob *)((long)fc->partition_cdf[0] + lVar29),(int *)0x0);
    lVar29 = lVar29 + 0x16;
    pMVar21 = (ModeCosts *)(pMVar21->partition_cost + 1);
  } while (lVar29 != 0x1b8);
  if ((cm->current_frame).skip_mode_info.skip_mode_flag != 0) {
    paaVar26 = fc->skip_mode_cdfs;
    lVar29 = 0;
    do {
      av1_cost_tokens_from_cdf
                ((int *)((long)mode_costs->skip_mode_cost[0] + lVar29),*paaVar26,(int *)0x0);
      paaVar26 = paaVar26 + 1;
      lVar29 = lVar29 + 8;
    } while (lVar29 != 0x18);
  }
  paaVar26 = fc->skip_txfm_cdfs;
  lVar29 = 0;
  do {
    av1_cost_tokens_from_cdf
              ((int *)((long)mode_costs->skip_txfm_cost[0] + lVar29),*paaVar26,(int *)0x0);
    paaVar26 = paaVar26 + 1;
    lVar29 = lVar29 + 8;
  } while (lVar29 != 0x18);
  paaiVar10 = mode_costs->y_mode_costs;
  paaaVar30 = fc->kf_y_cdf;
  lVar29 = 0;
  do {
    lVar27 = 0;
    costs_00 = paaiVar10;
    do {
      av1_cost_tokens_from_cdf
                ((int *)costs_00,(aom_cdf_prob *)((long)(*paaaVar30)[0] + lVar27),(int *)0x0);
      costs_00 = (int (*) [13] [13])(*costs_00 + 1);
      lVar27 = lVar27 + 0x1c;
    } while (lVar27 != 0x8c);
    lVar29 = lVar29 + 1;
    paaiVar10 = paaiVar10 + 1;
    paaaVar30 = paaaVar30 + 1;
  } while (lVar29 != 5);
  costs_01 = mode_costs->mbmode_cost;
  lVar29 = 0;
  do {
    av1_cost_tokens_from_cdf
              (*costs_01,(aom_cdf_prob *)((long)fc->y_mode_cdf[0] + lVar29),(int *)0x0);
    lVar29 = lVar29 + 0x1c;
    costs_01 = costs_01 + 1;
  } while (lVar29 != 0x70);
  paaiVar11 = mode_costs->intra_uv_mode_cost;
  paaaVar31 = fc->uv_mode_cdf;
  lVar29 = 0;
  do {
    lVar27 = 0;
    costs_02 = paaiVar11;
    do {
      av1_cost_tokens_from_cdf
                ((int *)costs_02,(aom_cdf_prob *)((long)(*paaaVar31)[0] + lVar27),(int *)0x0);
      costs_02 = (int (*) [13] [14])(*costs_02 + 1);
      lVar27 = lVar27 + 0x1e;
    } while (lVar27 != 0x186);
    paaiVar11 = paaiVar11 + 1;
    paaaVar31 = paaaVar31 + 1;
    bVar41 = lVar29 == 0;
    lVar29 = lVar29 + 1;
  } while (bVar41);
  uVar12 = 0;
  av1_cost_tokens_from_cdf(mode_costs->filter_intra_mode_cost,fc->filter_intra_mode_cdf,(int *)0x0);
  paiVar24 = mode_costs->filter_intra_cost;
  paaVar26 = fc->filter_intra_cdfs;
  do {
    if (((cm->seq_params->enable_filter_intra != '\0') && ((0x1f07ffUL >> (uVar12 & 0x3f) & 1) != 0)
        ) && ((0x2f0bffUL >> (uVar12 & 0x3f) & 1) != 0)) {
      av1_cost_tokens_from_cdf(*paiVar24,*paaVar26,(int *)0x0);
    }
    uVar12 = uVar12 + 1;
    paaVar26 = paaVar26 + 1;
    paiVar24 = paiVar24 + 1;
  } while (uVar12 != 0x16);
  paiVar22 = mode_costs->switchable_interp_costs;
  lVar29 = 0;
  do {
    av1_cost_tokens_from_cdf
              (*paiVar22,(aom_cdf_prob *)((long)fc->switchable_interp_cdf[0] + lVar29),(int *)0x0);
    lVar29 = lVar29 + 8;
    paiVar22 = paiVar22 + 1;
  } while (lVar29 != 0x80);
  paaiVar17 = mode_costs->palette_y_mode_cost;
  paaaVar35 = fc->palette_y_mode_cdf;
  lVar29 = 0;
  do {
    av1_cost_tokens_from_cdf
              (mode_costs->palette_y_size_cost[lVar29],fc->palette_y_size_cdf[lVar29],(int *)0x0);
    av1_cost_tokens_from_cdf
              (mode_costs->palette_uv_size_cost[lVar29],fc->palette_uv_size_cdf[lVar29],(int *)0x0);
    lVar27 = 0;
    paaiVar23 = paaiVar17;
    do {
      av1_cost_tokens_from_cdf
                ((int *)paaiVar23,(aom_cdf_prob *)((long)(*paaaVar35)[0] + lVar27),(int *)0x0);
      paaiVar23 = (int (*) [3] [2])(*paaiVar23 + 1);
      lVar27 = lVar27 + 6;
    } while (lVar27 != 0x12);
    lVar29 = lVar29 + 1;
    paaiVar17 = paaiVar17 + 1;
    paaaVar35 = paaaVar35 + 1;
  } while (lVar29 != 7);
  paaVar26 = fc->palette_uv_mode_cdf;
  lVar29 = 0;
  do {
    av1_cost_tokens_from_cdf
              ((int *)((long)mode_costs->palette_uv_mode_cost[0] + lVar29),*paaVar26,(int *)0x0);
    lVar29 = lVar29 + 8;
    paaVar26 = paaVar26 + 1;
  } while (lVar29 == 8);
  paaaVar13 = fc->palette_y_color_index_cdf;
  lVar29 = 0;
  pMVar21 = mode_costs;
  do {
    lVar27 = 0;
    cdf = paaaVar13;
    do {
      av1_cost_tokens_from_cdf
                ((int *)((long)pMVar21->palette_y_color_cost[0][0] + lVar27),(aom_cdf_prob *)cdf,
                 (int *)0x0);
      av1_cost_tokens_from_cdf
                ((int *)((long)pMVar21->palette_uv_color_cost[0][0] + lVar27),
                 (aom_cdf_prob *)(cdf + 7),(int *)0x0);
      lVar27 = lVar27 + 0x20;
      cdf = (aom_cdf_prob (*) [5] [9])(*cdf + 1);
    } while (lVar27 != 0xa0);
    lVar29 = lVar29 + 1;
    pMVar21 = (ModeCosts *)(pMVar21->partition_cost + 4);
    paaaVar13 = paaaVar13 + 1;
  } while (lVar29 != 7);
  av1_cost_tokens_from_cdf(local_58,fc->cfl_sign_cdf,(int *)0x0);
  paaiVar1 = mode_costs->cfl_cost;
  uVar12 = 0;
  paaiVar37 = paaiVar1;
  do {
    costs = paaiVar1 + uVar12;
    if (uVar12 < 2) {
      ((int *)((long)costs + 0))[0xc] = 0;
      ((int *)((long)costs + 0))[0xd] = 0;
      ((int *)((long)costs + 0))[0xe] = 0;
      ((int *)((long)costs + 0))[0xf] = 0;
      ((int *)((long)costs + 0))[8] = 0;
      ((int *)((long)costs + 0))[9] = 0;
      ((int *)((long)costs + 0))[10] = 0;
      ((int *)((long)costs + 0))[0xb] = 0;
      ((int *)((long)costs + 0))[4] = 0;
      ((int *)((long)costs + 0))[5] = 0;
      ((int *)((long)costs + 0))[6] = 0;
      ((int *)((long)costs + 0))[7] = 0;
      ((int *)((long)costs + 0))[0] = 0;
      ((int *)((long)costs + 0))[1] = 0;
      ((int *)((long)costs + 0))[2] = 0;
      ((int *)((long)costs + 0))[3] = 0;
    }
    else {
      av1_cost_tokens_from_cdf((int *)costs,fc->cfl_sign_cdf + uVar12 * 0x11 + -0x19,(int *)0x0);
    }
    paiVar40 = paaiVar1[uVar12] + 1;
    uVar4 = uVar12 + 1;
    uVar8 = (uint)((int)uVar4 * 0xb) >> 5;
    iVar9 = (int)uVar4 + uVar8 * -3;
    if (iVar9 == 0) {
      *(int *)((long)(paaiVar1[uVar12] + 1) + 0x30) = 0;
      *(int *)((long)(paaiVar1[uVar12] + 1) + 0x34) = 0;
      *(int *)((long)(paaiVar1[uVar12] + 1) + 0x38) = 0;
      *(int *)((long)(paaiVar1[uVar12] + 1) + 0x3c) = 0;
      *(int *)((long)(paaiVar1[uVar12] + 1) + 0x20) = 0;
      *(int *)((long)(paaiVar1[uVar12] + 1) + 0x24) = 0;
      *(int *)((long)(paaiVar1[uVar12] + 1) + 0x28) = 0;
      *(int *)((long)(paaiVar1[uVar12] + 1) + 0x2c) = 0;
      *(int *)((long)(paaiVar1[uVar12] + 1) + 0x10) = 0;
      *(int *)((long)(paaiVar1[uVar12] + 1) + 0x14) = 0;
      *(int *)((long)(paaiVar1[uVar12] + 1) + 0x18) = 0;
      *(int *)((long)(paaiVar1[uVar12] + 1) + 0x1c) = 0;
      *(int *)((long)paiVar40 + 0) = 0;
      *(int *)((long)paiVar40 + 4) = 0;
      *(int *)((long)(paaiVar1[uVar12] + 1) + 8) = 0;
      *(int *)((long)(paaiVar1[uVar12] + 1) + 0xc) = 0;
    }
    else {
      av1_cost_tokens_from_cdf
                (*paiVar40,fc->cfl_alpha_cdf[(int)(uVar8 + iVar9 * 3 + -3)],(int *)0x0);
    }
    iVar9 = local_58[uVar12];
    lVar29 = 0;
    do {
      piVar2 = (*paaiVar37)[0] + lVar29;
      iVar5 = piVar2[1];
      iVar6 = piVar2[2];
      iVar7 = piVar2[3];
      piVar3 = (*paaiVar37)[0] + lVar29;
      *piVar3 = *piVar2 + iVar9;
      piVar3[1] = iVar5 + iVar9;
      piVar3[2] = iVar6 + iVar9;
      piVar3[3] = iVar7 + iVar9;
      lVar29 = lVar29 + 4;
    } while (lVar29 != 0x10);
    paaiVar37 = paaiVar37 + 1;
    uVar12 = uVar4;
  } while (uVar4 != 8);
  paaiVar14 = mode_costs->tx_size_cost;
  paaaVar32 = fc->tx_size_cdf;
  lVar29 = 0;
  do {
    lVar27 = 0;
    costs_03 = paaiVar14;
    do {
      av1_cost_tokens_from_cdf
                ((int *)costs_03,(aom_cdf_prob *)((long)(*paaaVar32)[0] + lVar27),(int *)0x0);
      costs_03 = (int (*) [3] [5])(*costs_03 + 1);
      lVar27 = lVar27 + 8;
    } while (lVar27 != 0x18);
    lVar29 = lVar29 + 1;
    paaiVar14 = paaiVar14 + 1;
    paaaVar32 = paaaVar32 + 1;
  } while (lVar29 != 4);
  paiVar24 = mode_costs->txfm_partition_cost;
  lVar29 = 0;
  do {
    av1_cost_tokens_from_cdf
              (*paiVar24,(aom_cdf_prob *)((long)fc->txfm_partition_cdf[0] + lVar29),(int *)0x0);
    lVar29 = lVar29 + 6;
    paiVar24 = paiVar24 + 1;
  } while (lVar29 != 0x7e);
  paaiVar28 = mode_costs->inter_tx_type_costs + 1;
  paaaVar25 = fc->inter_ext_tx_cdf + 1;
  paaaiVar19 = mode_costs->intra_tx_type_costs + 1;
  paaaaVar38 = fc->intra_ext_tx_cdf + 1;
  lVar29 = 0x507c50;
  local_90 = 0;
  do {
    lVar27 = 0;
    cdf_00 = paaaVar25;
    costs_06 = paaiVar28;
    do {
      if (*(int *)(lVar29 + lVar27 * 4) != 0) {
        av1_cost_tokens_from_cdf
                  ((int *)costs_06,(aom_cdf_prob *)cdf_00,
                   av1_ext_tx_inv[*(int *)((long)av1_ext_tx_set_idx_to_type[1] + lVar27 + 4)]);
      }
      lVar27 = lVar27 + 4;
      costs_06 = costs_06 + 1;
      cdf_00 = cdf_00 + 1;
    } while (lVar27 != 0xc);
    lVar27 = 1;
    paaaiVar20 = paaaiVar19;
    paaaaVar39 = paaaaVar38;
    do {
      if (use_intra_ext_tx_for_txsize[lVar27][local_90] != 0) {
        iVar9 = av1_ext_tx_set_idx_to_type[0][lVar27];
        lVar33 = 0;
        costs_07 = paaaiVar20;
        do {
          av1_cost_tokens_from_cdf
                    ((int *)costs_07,(aom_cdf_prob *)((long)(*paaaaVar39)[0][0] + lVar33),
                     av1_ext_tx_inv[iVar9]);
          costs_07 = (int (*) [4] [13] [16])((*costs_07)[0] + 1);
          lVar33 = lVar33 + 0x22;
        } while (lVar33 != 0x1ba);
      }
      lVar27 = lVar27 + 1;
      paaaiVar20 = paaaiVar20 + 1;
      paaaaVar39 = paaaaVar39 + 1;
    } while (lVar27 != 3);
    local_90 = local_90 + 1;
    lVar29 = lVar29 + 4;
    paaiVar28 = (int (*) [4] [16])(*paaiVar28 + 1);
    paaaVar25 = (aom_cdf_prob (*) [4] [17])(*paaaVar25 + 1);
    paaaiVar19 = (int (*) [4] [13] [16])(*paaaiVar19 + 1);
    paaaaVar38 = (aom_cdf_prob (*) [4] [13] [17])(*paaaaVar38 + 1);
  } while (local_90 != 4);
  costs_04 = mode_costs->angle_delta_cost;
  lVar29 = 0;
  do {
    av1_cost_tokens_from_cdf
              (*costs_04,(aom_cdf_prob *)((long)fc->angle_delta_cdf[0] + lVar29),(int *)0x0);
    lVar29 = lVar29 + 0x10;
    costs_04 = costs_04 + 1;
  } while (lVar29 != 0x80);
  lVar29 = 0;
  av1_cost_tokens_from_cdf(mode_costs->intrabc_cost,fc->intrabc_cdf,(int *)0x0);
  costs_05 = mode_costs->spatial_pred_cost;
  do {
    av1_cost_tokens_from_cdf
              (*costs_05,(aom_cdf_prob *)((long)(fc->seg).spatial_pred_seg_cdf[0] + lVar29),
               (int *)0x0);
    lVar29 = lVar29 + 0x12;
    costs_05 = costs_05 + 1;
  } while (lVar29 != 0x36);
  cdf_01 = &fc->seg;
  lVar29 = 0;
  do {
    av1_cost_tokens_from_cdf
              ((int *)((long)mode_costs->tmp_pred_cost[0] + lVar29),(aom_cdf_prob *)cdf_01,
               (int *)0x0);
    cdf_01 = (segmentation_probs *)(cdf_01->pred_cdf + 1);
    lVar29 = lVar29 + 8;
  } while (lVar29 != 0x18);
  if (((cm->current_frame).frame_type & 0xfd) != 0) {
    paiVar24 = mode_costs->comp_inter_cost;
    lVar29 = 0;
    do {
      av1_cost_tokens_from_cdf
                (*paiVar24,(aom_cdf_prob *)((long)fc->comp_inter_cdf[0] + lVar29),(int *)0x0);
      lVar29 = lVar29 + 6;
      paiVar24 = paiVar24 + 1;
    } while (lVar29 != 0x1e);
    paaiVar15 = mode_costs->single_ref_cost;
    paaaVar34 = fc->single_ref_cdf;
    lVar29 = 0;
    do {
      lVar27 = 0;
      costs_08 = paaiVar15;
      do {
        av1_cost_tokens_from_cdf
                  ((int *)costs_08,(aom_cdf_prob *)((long)(*paaaVar34)[0] + lVar27),(int *)0x0);
        costs_08 = (int (*) [6] [2])(*costs_08 + 1);
        lVar27 = lVar27 + 6;
      } while (lVar27 != 0x24);
      lVar29 = lVar29 + 1;
      paaiVar15 = paaiVar15 + 1;
      paaaVar34 = paaaVar34 + 1;
    } while (lVar29 != 3);
    paiVar22 = mode_costs->comp_ref_type_cost;
    lVar29 = 0;
    do {
      av1_cost_tokens_from_cdf
                (*paiVar22,(aom_cdf_prob *)((long)fc->comp_ref_type_cdf[0] + lVar29),(int *)0x0);
      lVar29 = lVar29 + 6;
      paiVar22 = paiVar22 + 1;
    } while (lVar29 != 0x1e);
    paaiVar16 = mode_costs->uni_comp_ref_cost;
    paaaVar35 = fc->uni_comp_ref_cdf;
    lVar29 = 0;
    do {
      lVar27 = 0;
      costs_09 = paaiVar16;
      do {
        av1_cost_tokens_from_cdf
                  ((int *)costs_09,(aom_cdf_prob *)((long)(*paaaVar35)[0] + lVar27),(int *)0x0);
        costs_09 = (int (*) [3] [3])(*costs_09 + 1);
        lVar27 = lVar27 + 6;
      } while (lVar27 != 0x12);
      lVar29 = lVar29 + 1;
      paaiVar16 = paaiVar16 + 1;
      paaaVar35 = paaaVar35 + 1;
    } while (lVar29 != 3);
    paaiVar17 = mode_costs->comp_ref_cost;
    paaaVar35 = fc->comp_ref_cdf;
    lVar29 = 0;
    do {
      lVar27 = 0;
      paaiVar23 = paaiVar17;
      do {
        av1_cost_tokens_from_cdf
                  ((int *)paaiVar23,(aom_cdf_prob *)((long)(*paaaVar35)[0] + lVar27),(int *)0x0);
        paaiVar23 = (int (*) [3] [2])(*paaiVar23 + 1);
        lVar27 = lVar27 + 6;
      } while (lVar27 != 0x12);
      lVar29 = lVar29 + 1;
      paaiVar17 = paaiVar17 + 1;
      paaaVar35 = paaaVar35 + 1;
    } while (lVar29 != 3);
    paaiVar18 = mode_costs->comp_bwdref_cost;
    paaaVar36 = fc->comp_bwdref_cdf;
    lVar29 = 0;
    do {
      lVar27 = 0;
      costs_10 = paaiVar18;
      do {
        av1_cost_tokens_from_cdf
                  ((int *)costs_10,(aom_cdf_prob *)((long)(*paaaVar36)[0] + lVar27),(int *)0x0);
        lVar27 = lVar27 + 6;
        costs_10 = (int (*) [2] [2])(*costs_10 + 1);
      } while (lVar27 == 6);
      lVar29 = lVar29 + 1;
      paaiVar18 = paaiVar18 + 1;
      paaaVar36 = paaaVar36 + 1;
    } while (lVar29 != 3);
    paaVar26 = fc->intra_inter_cdf;
    lVar29 = 0;
    do {
      av1_cost_tokens_from_cdf
                ((int *)((long)mode_costs->intra_inter_cost[0] + lVar29),*paaVar26,(int *)0x0);
      paaVar26 = paaVar26 + 1;
      lVar29 = lVar29 + 8;
    } while (lVar29 != 0x20);
    paaVar26 = fc->newmv_cdf;
    lVar29 = 0;
    do {
      av1_cost_tokens_from_cdf
                ((int *)((long)mode_costs->newmv_mode_cost[0] + lVar29),*paaVar26,(int *)0x0);
      paaVar26 = paaVar26 + 1;
      lVar29 = lVar29 + 8;
    } while (lVar29 != 0x30);
    paaVar26 = fc->zeromv_cdf;
    lVar29 = 0;
    do {
      av1_cost_tokens_from_cdf
                ((int *)((long)mode_costs->zeromv_mode_cost[0] + lVar29),*paaVar26,(int *)0x0);
      lVar29 = lVar29 + 8;
      paaVar26 = paaVar26 + 1;
    } while (lVar29 == 8);
    paaVar26 = fc->refmv_cdf;
    lVar29 = 0;
    do {
      av1_cost_tokens_from_cdf
                ((int *)((long)mode_costs->refmv_mode_cost[0] + lVar29),*paaVar26,(int *)0x0);
      paaVar26 = paaVar26 + 1;
      lVar29 = lVar29 + 8;
    } while (lVar29 != 0x30);
    paaVar26 = fc->drl_cdf;
    lVar29 = 0;
    do {
      av1_cost_tokens_from_cdf
                ((int *)((long)mode_costs->drl_mode_cost0[0] + lVar29),*paaVar26,(int *)0x0);
      paaVar26 = paaVar26 + 1;
      lVar29 = lVar29 + 8;
    } while (lVar29 != 0x18);
    cdf_04 = fc->inter_compound_mode_cdf;
    lVar29 = 0;
    do {
      av1_cost_tokens_from_cdf
                ((int *)((long)mode_costs->inter_compound_mode_cost[0] + lVar29),*cdf_04,(int *)0x0)
      ;
      cdf_04 = cdf_04 + 1;
      lVar29 = lVar29 + 0x20;
    } while (lVar29 != 0x100);
    paaVar26 = fc->compound_type_cdf;
    lVar29 = 0;
    do {
      av1_cost_tokens_from_cdf
                ((int *)((long)mode_costs->compound_type_cost[0] + lVar29),*paaVar26,(int *)0x0);
      paaVar26 = paaVar26 + 1;
      lVar29 = lVar29 + 8;
    } while (lVar29 != 0xb0);
    paiVar40 = mode_costs->wedge_idx_cost;
    cdf_02 = fc->wedge_idx_cdf;
    lVar29 = 0;
    do {
      if (0 < *(int *)((long)&av1_wedge_params_lookup[0].wedge_types + lVar29)) {
        av1_cost_tokens_from_cdf(*paiVar40,*cdf_02,(int *)0x0);
      }
      cdf_02 = cdf_02 + 1;
      paiVar40 = paiVar40 + 1;
      lVar29 = lVar29 + 0x20;
    } while (lVar29 != 0x2c0);
    paiVar24 = mode_costs->interintra_cost;
    paaVar26 = fc->interintra_cdf;
    cdf_03 = fc->interintra_mode_cdf;
    lVar29 = 0;
    do {
      av1_cost_tokens_from_cdf(*paiVar24,*paaVar26,(int *)0x0);
      av1_cost_tokens_from_cdf
                ((int *)((long)mode_costs->interintra_mode_cost[0] + lVar29),*cdf_03,(int *)0x0);
      cdf_03 = cdf_03 + 1;
      lVar29 = lVar29 + 0x10;
      paaVar26 = paaVar26 + 1;
      paiVar24 = paiVar24 + 1;
    } while (lVar29 != 0x40);
    paaVar26 = fc->wedge_interintra_cdf;
    lVar29 = 0;
    do {
      av1_cost_tokens_from_cdf
                ((int *)((long)mode_costs->wedge_interintra_cost[0] + lVar29),*paaVar26,(int *)0x0);
      paaVar26 = paaVar26 + 1;
      lVar29 = lVar29 + 8;
    } while (lVar29 != 0xb0);
    cdf_05 = fc->motion_mode_cdf + 3;
    lVar29 = 0;
    do {
      av1_cost_tokens_from_cdf
                ((int *)((long)mode_costs->motion_mode_cost[3] + lVar29),*cdf_05,(int *)0x0);
      cdf_05 = cdf_05 + 1;
      lVar29 = lVar29 + 0xc;
    } while (lVar29 != 0xe4);
    paiVar24 = mode_costs->motion_mode_cost1 + 3;
    lVar29 = 0;
    do {
      av1_cost_tokens_from_cdf
                (*paiVar24,(aom_cdf_prob *)((long)fc->obmc_cdf[3] + lVar29),(int *)0x0);
      lVar29 = lVar29 + 6;
      paiVar24 = paiVar24 + 1;
    } while (lVar29 != 0x72);
    paaVar26 = fc->compound_index_cdf;
    lVar29 = 0;
    do {
      av1_cost_tokens_from_cdf
                ((int *)((long)mode_costs->comp_idx_cost[0] + lVar29),*paaVar26,(int *)0x0);
      paaVar26 = paaVar26 + 1;
      lVar29 = lVar29 + 8;
    } while (lVar29 != 0x30);
    paaVar26 = fc->comp_group_idx_cdf;
    lVar29 = 0;
    do {
      av1_cost_tokens_from_cdf
                ((int *)((long)mode_costs->comp_group_idx_cost[0] + lVar29),*paaVar26,(int *)0x0);
      paaVar26 = paaVar26 + 1;
      lVar29 = lVar29 + 8;
    } while (lVar29 != 0x30);
  }
  return;
}

Assistant:

void av1_fill_mode_rates(AV1_COMMON *const cm, ModeCosts *mode_costs,
                         FRAME_CONTEXT *fc) {
  int i, j;

  for (i = 0; i < PARTITION_CONTEXTS; ++i)
    av1_cost_tokens_from_cdf(mode_costs->partition_cost[i],
                             fc->partition_cdf[i], NULL);

  if (cm->current_frame.skip_mode_info.skip_mode_flag) {
    for (i = 0; i < SKIP_MODE_CONTEXTS; ++i) {
      av1_cost_tokens_from_cdf(mode_costs->skip_mode_cost[i],
                               fc->skip_mode_cdfs[i], NULL);
    }
  }

  for (i = 0; i < SKIP_CONTEXTS; ++i) {
    av1_cost_tokens_from_cdf(mode_costs->skip_txfm_cost[i],
                             fc->skip_txfm_cdfs[i], NULL);
  }

  for (i = 0; i < KF_MODE_CONTEXTS; ++i)
    for (j = 0; j < KF_MODE_CONTEXTS; ++j)
      av1_cost_tokens_from_cdf(mode_costs->y_mode_costs[i][j],
                               fc->kf_y_cdf[i][j], NULL);

  for (i = 0; i < BLOCK_SIZE_GROUPS; ++i)
    av1_cost_tokens_from_cdf(mode_costs->mbmode_cost[i], fc->y_mode_cdf[i],
                             NULL);
  for (i = 0; i < CFL_ALLOWED_TYPES; ++i)
    for (j = 0; j < INTRA_MODES; ++j)
      av1_cost_tokens_from_cdf(mode_costs->intra_uv_mode_cost[i][j],
                               fc->uv_mode_cdf[i][j], NULL);

  av1_cost_tokens_from_cdf(mode_costs->filter_intra_mode_cost,
                           fc->filter_intra_mode_cdf, NULL);
  for (i = 0; i < BLOCK_SIZES_ALL; ++i) {
    if (av1_filter_intra_allowed_bsize(cm, i))
      av1_cost_tokens_from_cdf(mode_costs->filter_intra_cost[i],
                               fc->filter_intra_cdfs[i], NULL);
  }

  for (i = 0; i < SWITCHABLE_FILTER_CONTEXTS; ++i)
    av1_cost_tokens_from_cdf(mode_costs->switchable_interp_costs[i],
                             fc->switchable_interp_cdf[i], NULL);

  for (i = 0; i < PALATTE_BSIZE_CTXS; ++i) {
    av1_cost_tokens_from_cdf(mode_costs->palette_y_size_cost[i],
                             fc->palette_y_size_cdf[i], NULL);
    av1_cost_tokens_from_cdf(mode_costs->palette_uv_size_cost[i],
                             fc->palette_uv_size_cdf[i], NULL);
    for (j = 0; j < PALETTE_Y_MODE_CONTEXTS; ++j) {
      av1_cost_tokens_from_cdf(mode_costs->palette_y_mode_cost[i][j],
                               fc->palette_y_mode_cdf[i][j], NULL);
    }
  }

  for (i = 0; i < PALETTE_UV_MODE_CONTEXTS; ++i) {
    av1_cost_tokens_from_cdf(mode_costs->palette_uv_mode_cost[i],
                             fc->palette_uv_mode_cdf[i], NULL);
  }

  for (i = 0; i < PALETTE_SIZES; ++i) {
    for (j = 0; j < PALETTE_COLOR_INDEX_CONTEXTS; ++j) {
      av1_cost_tokens_from_cdf(mode_costs->palette_y_color_cost[i][j],
                               fc->palette_y_color_index_cdf[i][j], NULL);
      av1_cost_tokens_from_cdf(mode_costs->palette_uv_color_cost[i][j],
                               fc->palette_uv_color_index_cdf[i][j], NULL);
    }
  }

  int sign_cost[CFL_JOINT_SIGNS];
  av1_cost_tokens_from_cdf(sign_cost, fc->cfl_sign_cdf, NULL);
  for (int joint_sign = 0; joint_sign < CFL_JOINT_SIGNS; joint_sign++) {
    int *cost_u = mode_costs->cfl_cost[joint_sign][CFL_PRED_U];
    int *cost_v = mode_costs->cfl_cost[joint_sign][CFL_PRED_V];
    if (CFL_SIGN_U(joint_sign) == CFL_SIGN_ZERO) {
      memset(cost_u, 0, CFL_ALPHABET_SIZE * sizeof(*cost_u));
    } else {
      const aom_cdf_prob *cdf_u = fc->cfl_alpha_cdf[CFL_CONTEXT_U(joint_sign)];
      av1_cost_tokens_from_cdf(cost_u, cdf_u, NULL);
    }
    if (CFL_SIGN_V(joint_sign) == CFL_SIGN_ZERO) {
      memset(cost_v, 0, CFL_ALPHABET_SIZE * sizeof(*cost_v));
    } else {
      const aom_cdf_prob *cdf_v = fc->cfl_alpha_cdf[CFL_CONTEXT_V(joint_sign)];
      av1_cost_tokens_from_cdf(cost_v, cdf_v, NULL);
    }
    for (int u = 0; u < CFL_ALPHABET_SIZE; u++)
      cost_u[u] += sign_cost[joint_sign];
  }

  for (i = 0; i < MAX_TX_CATS; ++i)
    for (j = 0; j < TX_SIZE_CONTEXTS; ++j)
      av1_cost_tokens_from_cdf(mode_costs->tx_size_cost[i][j],
                               fc->tx_size_cdf[i][j], NULL);

  for (i = 0; i < TXFM_PARTITION_CONTEXTS; ++i) {
    av1_cost_tokens_from_cdf(mode_costs->txfm_partition_cost[i],
                             fc->txfm_partition_cdf[i], NULL);
  }

  for (i = TX_4X4; i < EXT_TX_SIZES; ++i) {
    int s;
    for (s = 1; s < EXT_TX_SETS_INTER; ++s) {
      if (use_inter_ext_tx_for_txsize[s][i]) {
        av1_cost_tokens_from_cdf(
            mode_costs->inter_tx_type_costs[s][i], fc->inter_ext_tx_cdf[s][i],
            av1_ext_tx_inv[av1_ext_tx_set_idx_to_type[1][s]]);
      }
    }
    for (s = 1; s < EXT_TX_SETS_INTRA; ++s) {
      if (use_intra_ext_tx_for_txsize[s][i]) {
        for (j = 0; j < INTRA_MODES; ++j) {
          av1_cost_tokens_from_cdf(
              mode_costs->intra_tx_type_costs[s][i][j],
              fc->intra_ext_tx_cdf[s][i][j],
              av1_ext_tx_inv[av1_ext_tx_set_idx_to_type[0][s]]);
        }
      }
    }
  }
  for (i = 0; i < DIRECTIONAL_MODES; ++i) {
    av1_cost_tokens_from_cdf(mode_costs->angle_delta_cost[i],
                             fc->angle_delta_cdf[i], NULL);
  }
  av1_cost_tokens_from_cdf(mode_costs->intrabc_cost, fc->intrabc_cdf, NULL);

  for (i = 0; i < SPATIAL_PREDICTION_PROBS; ++i) {
    av1_cost_tokens_from_cdf(mode_costs->spatial_pred_cost[i],
                             fc->seg.spatial_pred_seg_cdf[i], NULL);
  }

  for (i = 0; i < SEG_TEMPORAL_PRED_CTXS; ++i) {
    av1_cost_tokens_from_cdf(mode_costs->tmp_pred_cost[i], fc->seg.pred_cdf[i],
                             NULL);
  }

  if (!frame_is_intra_only(cm)) {
    for (i = 0; i < COMP_INTER_CONTEXTS; ++i) {
      av1_cost_tokens_from_cdf(mode_costs->comp_inter_cost[i],
                               fc->comp_inter_cdf[i], NULL);
    }

    for (i = 0; i < REF_CONTEXTS; ++i) {
      for (j = 0; j < SINGLE_REFS - 1; ++j) {
        av1_cost_tokens_from_cdf(mode_costs->single_ref_cost[i][j],
                                 fc->single_ref_cdf[i][j], NULL);
      }
    }

    for (i = 0; i < COMP_REF_TYPE_CONTEXTS; ++i) {
      av1_cost_tokens_from_cdf(mode_costs->comp_ref_type_cost[i],
                               fc->comp_ref_type_cdf[i], NULL);
    }

    for (i = 0; i < UNI_COMP_REF_CONTEXTS; ++i) {
      for (j = 0; j < UNIDIR_COMP_REFS - 1; ++j) {
        av1_cost_tokens_from_cdf(mode_costs->uni_comp_ref_cost[i][j],
                                 fc->uni_comp_ref_cdf[i][j], NULL);
      }
    }

    for (i = 0; i < REF_CONTEXTS; ++i) {
      for (j = 0; j < FWD_REFS - 1; ++j) {
        av1_cost_tokens_from_cdf(mode_costs->comp_ref_cost[i][j],
                                 fc->comp_ref_cdf[i][j], NULL);
      }
    }

    for (i = 0; i < REF_CONTEXTS; ++i) {
      for (j = 0; j < BWD_REFS - 1; ++j) {
        av1_cost_tokens_from_cdf(mode_costs->comp_bwdref_cost[i][j],
                                 fc->comp_bwdref_cdf[i][j], NULL);
      }
    }

    for (i = 0; i < INTRA_INTER_CONTEXTS; ++i) {
      av1_cost_tokens_from_cdf(mode_costs->intra_inter_cost[i],
                               fc->intra_inter_cdf[i], NULL);
    }

    for (i = 0; i < NEWMV_MODE_CONTEXTS; ++i) {
      av1_cost_tokens_from_cdf(mode_costs->newmv_mode_cost[i], fc->newmv_cdf[i],
                               NULL);
    }

    for (i = 0; i < GLOBALMV_MODE_CONTEXTS; ++i) {
      av1_cost_tokens_from_cdf(mode_costs->zeromv_mode_cost[i],
                               fc->zeromv_cdf[i], NULL);
    }

    for (i = 0; i < REFMV_MODE_CONTEXTS; ++i) {
      av1_cost_tokens_from_cdf(mode_costs->refmv_mode_cost[i], fc->refmv_cdf[i],
                               NULL);
    }

    for (i = 0; i < DRL_MODE_CONTEXTS; ++i) {
      av1_cost_tokens_from_cdf(mode_costs->drl_mode_cost0[i], fc->drl_cdf[i],
                               NULL);
    }
    for (i = 0; i < INTER_MODE_CONTEXTS; ++i)
      av1_cost_tokens_from_cdf(mode_costs->inter_compound_mode_cost[i],
                               fc->inter_compound_mode_cdf[i], NULL);
    for (i = 0; i < BLOCK_SIZES_ALL; ++i)
      av1_cost_tokens_from_cdf(mode_costs->compound_type_cost[i],
                               fc->compound_type_cdf[i], NULL);
    for (i = 0; i < BLOCK_SIZES_ALL; ++i) {
      if (av1_is_wedge_used(i)) {
        av1_cost_tokens_from_cdf(mode_costs->wedge_idx_cost[i],
                                 fc->wedge_idx_cdf[i], NULL);
      }
    }
    for (i = 0; i < BLOCK_SIZE_GROUPS; ++i) {
      av1_cost_tokens_from_cdf(mode_costs->interintra_cost[i],
                               fc->interintra_cdf[i], NULL);
      av1_cost_tokens_from_cdf(mode_costs->interintra_mode_cost[i],
                               fc->interintra_mode_cdf[i], NULL);
    }
    for (i = 0; i < BLOCK_SIZES_ALL; ++i) {
      av1_cost_tokens_from_cdf(mode_costs->wedge_interintra_cost[i],
                               fc->wedge_interintra_cdf[i], NULL);
    }
    for (i = BLOCK_8X8; i < BLOCK_SIZES_ALL; i++) {
      av1_cost_tokens_from_cdf(mode_costs->motion_mode_cost[i],
                               fc->motion_mode_cdf[i], NULL);
    }
    for (i = BLOCK_8X8; i < BLOCK_SIZES_ALL; i++) {
      av1_cost_tokens_from_cdf(mode_costs->motion_mode_cost1[i],
                               fc->obmc_cdf[i], NULL);
    }
    for (i = 0; i < COMP_INDEX_CONTEXTS; ++i) {
      av1_cost_tokens_from_cdf(mode_costs->comp_idx_cost[i],
                               fc->compound_index_cdf[i], NULL);
    }
    for (i = 0; i < COMP_GROUP_IDX_CONTEXTS; ++i) {
      av1_cost_tokens_from_cdf(mode_costs->comp_group_idx_cost[i],
                               fc->comp_group_idx_cdf[i], NULL);
    }
  }
}